

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

Variable __thiscall LiteScript::_Type_STRING::Convert(_Type_STRING *this,Variable *obj,Type *type)

{
  String *string;
  bool bVar1;
  Object *pOVar2;
  Type *in_RCX;
  uint *extraout_RDX;
  Variable *res;
  Variable VVar4;
  uint *puVar3;
  
  bVar1 = Type::operator==(in_RCX,(Type *)_type_string);
  pOVar2 = Variable::operator->((Variable *)type);
  if (bVar1) {
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    pOVar2 = Variable::operator->((Variable *)type);
    string = (String *)pOVar2->data;
    pOVar2 = Variable::operator->((Variable *)this);
    String::operator=((String *)pOVar2->data,string);
    puVar3 = extraout_RDX;
  }
  else {
    VVar4 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    puVar3 = VVar4.nb_ref;
  }
  VVar4.nb_ref = puVar3;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_STRING::Convert(const LiteScript::Variable& obj, const LiteScript::Type& type) const {
    if (type == Type::STRING) {
        Variable res = obj->memory.Create(Type::STRING);
        res->GetData<String>() = obj->GetData<String>();
        return res;
    }
    else {
        return obj->memory.Create(Type::NIL);
    }
}